

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_handler_STORM(project_monster_handler_context_t *context)

{
  short sVar1;
  _Bool _Var2;
  mon_messages mVar3;
  uint32_t uVar4;
  int iVar5;
  wchar_t wVar6;
  
  project_monster_resist_other(context,L'V',L'\0',false,MON_MSG_IMMUNE);
  if (context->dam == L'\0') {
    return;
  }
  _Var2 = flag_has_dbg(context->mon->race->flags,0xc,0x51,"context->mon->race->flags","RF_IM_ELEC");
  if (_Var2) {
    wVar6 = context->dam / 2;
    mVar3 = MON_MSG_RESIST_SOMEWHAT;
  }
  else {
    uVar4 = Rand_div(6);
    wVar6 = context->dam;
    if (uVar4 != 0) goto LAB_001c5d12;
    wVar6 = wVar6 + wVar6 / 2;
    mVar3 = MON_MSG_STRUCK_ELEC;
  }
  context->dam = wVar6;
  context->hurt_msg = mVar3;
LAB_001c5d12:
  if (L'2' < wVar6) {
    uVar4 = Rand_div(2);
    wVar6 = context->dam;
    if (uVar4 == 0) {
      iVar5 = 0x14;
      if (wVar6 < L'ü') {
        iVar5 = wVar6 / 0xc;
      }
      context->mon_timed[1] = (iVar5 + context->r) / (context->r + L'\x01');
    }
  }
  if ((L'\x14' < wVar6) && (uVar4 = Rand_div(3), uVar4 == 0)) {
    context->mon_timed[2] = (context->dam / 10 + context->r) / (context->r + L'\x01');
  }
  _Var2 = flag_has_dbg(context->mon->race->flags,0xd,0x15,"context->mon->race->flags","RSF_BR_GRAV")
  ;
  if ((!_Var2) &&
     (sVar1 = context->mon->maxhp, uVar4 = Rand_div(context->dam * 3), (int)sVar1 < (int)uVar4)) {
    context->teleport_distance = L'\n';
  }
  return;
}

Assistant:

static void project_monster_handler_STORM(project_monster_handler_context_t *context)
{
	/* Water - zero out the damage because this is an immunity flag. */
	project_monster_resist_other(context, RF_IM_WATER, 0, false, MON_MSG_IMMUNE);
	if (context->dam == 0) return;

	/* Electricity */
	if (rf_has(context->mon->race->flags, RF_IM_ELEC)) {
		context->dam /= 2;
		context->hurt_msg = MON_MSG_RESIST_SOMEWHAT;
	} else if (one_in_(6)) {
		context->dam += context->dam / 2;
		context->hurt_msg = MON_MSG_STRUCK_ELEC;
	}

	/* Can stun, if enough damage is done. */
	if ((context->dam > 50) && one_in_(2)) {
		context->mon_timed[MON_TMD_STUN] =
			adjust_radius(context, MIN(context->dam / 12, 20));
	}

	/* Can confuse, if monster can be confused. */
	if ((context->dam > 20) && one_in_(3)) {
		context->mon_timed[MON_TMD_CONF] =
			adjust_radius(context, context->dam / 10);
	}

	/* Throw the monster around sometimes */
	if (!rsf_has(context->mon->race->flags, RSF_BR_GRAV) &&
		context->mon->maxhp < randint0(context->dam * 3)) {
		context->teleport_distance = 10;
	}
}